

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::CheckLyLyc(GB *this)

{
  u8 *puVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = (this->s).io[0x41];
  bVar3 = ((this->s).io[0x44] == (this->s).io[0x45]) * '\x04';
  (this->s).io[0x41] = (bVar2 & 0xfb) + bVar3;
  if (((bVar2 & 0x40) != 0) && ((bVar3 & (bVar2 ^ 0xff)) != 0)) {
    puVar1 = (this->s).io + 0xf;
    *puVar1 = *puVar1 | 2;
  }
  return;
}

Assistant:

void GB::CheckLyLyc() {
  u8 old = s.io[STAT] & 4;
  u8 now = !!(s.io[LY] == s.io[LYC]) << 2;
  s.io[STAT] = (s.io[STAT] & ~4) | now;
  if ((now & (old ^ now)) && (s.io[STAT] & 0x40)) {
    s.io[IF] |= 2;
    DPRINT(INTERRUPTS, "trigger STAT IF 2 ly=lyc=%d\n", s.io[LY]);
  }
}